

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O3

void __thiscall QRubberBand::changeEvent(QRubberBand *this,QEvent *e)

{
  short sVar1;
  uint uVar2;
  QFlagsStorage<Qt::WindowType> flags;
  QEvent *pQVar3;
  
  pQVar3 = e;
  QWidget::changeEvent(&this->super_QWidget,e);
  flags.i = (Int)pQVar3;
  sVar1 = *(short *)(e + 8);
  if (sVar1 == 0x15) {
    uVar2 = 0xd;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      uVar2 = 0;
    }
    flags.i = uVar2 | (((this->super_QWidget).data)->window_flags).
                      super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 0xfffffff2;
    QWidget::setWindowFlags(&this->super_QWidget,(WindowFlags)flags.i);
    sVar1 = *(short *)(e + 8);
  }
  if (sVar1 == 0x7e) {
    QWidget::raise(&this->super_QWidget,flags.i);
    return;
  }
  return;
}

Assistant:

void QRubberBand::changeEvent(QEvent *e)
{
    QWidget::changeEvent(e);
    switch (e->type()) {
    case QEvent::ParentChange:
        if (parent()) {
            setWindowFlags(windowFlags() & ~RUBBERBAND_WINDOW_TYPE);
        } else {
            setWindowFlags(windowFlags() | RUBBERBAND_WINDOW_TYPE);
        }
        break;
    default:
        break;
    }

    if (e->type() == QEvent::ZOrderChange)
        raise();
}